

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O3

bool __thiscall deqp::egl::ConfigFilter::isMatch(ConfigFilter *this,SurfaceConfig *config)

{
  uint uVar1;
  deUint32 attribute;
  int iVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  TestError *this_00;
  _Self __tmp;
  _Rb_tree_header *p_Var5;
  
  p_Var4 = (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->m_rules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      uVar1 = *(uint *)&p_Var4[1]._M_parent;
      if ((uVar1 != 0xffffffff) &&
         (attribute = *(deUint32 *)&p_Var4[1].field_0x4, 2 < attribute - 0x3035)) {
        if (attribute == 0x3041) {
          if (uVar1 != 0x3038) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"rule.value == EGL_NONE",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                       ,400);
LAB_00e86e93:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        else {
          iVar2 = *(int *)((long)&p_Var4[1]._M_parent + 4);
          uVar3 = eglu::ConfigInfo::getAttribute(&config->m_info,attribute);
          if (iVar2 == 0) {
            if ((int)uVar3 < (int)uVar1) {
              return false;
            }
          }
          else if (iVar2 == 2) {
            if ((uVar1 & ~uVar3) != 0) {
              return false;
            }
          }
          else {
            if (iVar2 != 1) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unknown criteria",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                         ,0x1a9);
              goto LAB_00e86e93;
            }
            if (uVar1 != uVar3) {
              return false;
            }
          }
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return true;
}

Assistant:

bool isMatch (const SurfaceConfig& config) const
	{
		for (std::map<EGLenum, AttribRule>::const_iterator iter = m_rules.begin(); iter != m_rules.end(); iter++)
		{
			const AttribRule rule = iter->second;

			if (rule.value == EGL_DONT_CARE)
				continue;
			else if (rule.name == EGL_MATCH_NATIVE_PIXMAP)
				TCU_CHECK(rule.value == EGL_NONE); // Not supported
			else if (rule.name == EGL_TRANSPARENT_RED_VALUE || rule.name == EGL_TRANSPARENT_GREEN_VALUE || rule.name == EGL_TRANSPARENT_BLUE_VALUE)
				continue;
			else
			{
				const EGLint cfgValue = config.getAttribute(rule.name);

				switch (rule.criteria)
				{
					case CRITERIA_EXACT:
						if (rule.value != cfgValue)
							return false;
						break;

					case CRITERIA_AT_LEAST:
						if (rule.value > cfgValue)
							return false;
						break;

					case CRITERIA_MASK:
						if ((rule.value & cfgValue) != rule.value)
							return false;
						break;

					default:
						TCU_FAIL("Unknown criteria");
				}
			}
		}

		return true;
	}